

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O3

FrameBuffer *
setupFramebuffer(FrameBuffer *__return_storage_ptr__,Header *header,
                list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                *intChannels,
                list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                *halfChannels,
                list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                *floatChannels)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  Vec2<int> *pVVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  ConstIterator tmp;
  Box2i local_48;
  
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pVVar3 = (Vec2<int> *)Imf_3_4::Header::dataWindow();
  local_48.min = *pVVar3;
  local_48.max = pVVar3[1];
  Imf_3_4::Header::channels();
  p_Var4 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::Header::channels();
    p_Var5 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var4 == p_Var5) break;
    _Var2 = p_Var4[9]._M_color;
    if (_Var2 == 2) {
      insertSlice<float>(&local_48,__return_storage_ptr__,(char *)(p_Var4 + 1),FLOAT,floatChannels);
    }
    else if (_Var2 == _S_black) {
      insertSlice<Imath_3_2::half>
                (&local_48,__return_storage_ptr__,(char *)(p_Var4 + 1),HALF,halfChannels);
    }
    else if (_Var2 == _S_red) {
      insertSlice<unsigned_int>
                (&local_48,__return_storage_ptr__,(char *)(p_Var4 + 1),UINT,intChannels);
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  return __return_storage_ptr__;
}

Assistant:

FrameBuffer
setupFramebuffer (
    const Header&            header,
    list<Array2D<uint32_t>>& intChannels,
    list<Array2D<half>>&     halfChannels,
    list<Array2D<float>>&    floatChannels)
{
    //
    // Allocate pixel buffers for all channels specified in the header, describe the layout of
    // the buffers in the FrameBuffer object.
    //

    FrameBuffer frameBuffer;
    Box2i       dataWindow = header.dataWindow ();

    for (auto i = header.channels ().begin (); i != header.channels ().end ();
         i++)
    {
        if (i.channel ().type == UINT)
        {
            insertSlice<uint32_t> (
                dataWindow,
                frameBuffer,
                i.name (),
                i.channel ().type,
                intChannels);
        }
        else if (i.channel ().type == HALF)
        {
            insertSlice<half> (
                dataWindow,
                frameBuffer,
                i.name (),
                i.channel ().type,
                halfChannels);
        }
        else if (i.channel ().type == FLOAT)
        {
            insertSlice<float> (
                dataWindow,
                frameBuffer,
                i.name (),
                i.channel ().type,
                floatChannels);
        }
    }

    return frameBuffer;
}